

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,char_writer *f)

{
  byte bVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  size_t size;
  char_type *__s;
  char_type *pcVar5;
  size_t __len_1;
  ulong uVar6;
  char __tmp;
  basic_buffer<char> *c;
  ulong uVar7;
  
  uVar2 = spec->width_;
  uVar7 = (ulong)uVar2;
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  if (uVar7 < 2) {
    uVar7 = lVar4 + 1;
    if ((ulong)puVar3[3] < uVar7) {
      (**(code **)*puVar3)(puVar3,uVar7);
    }
    puVar3[2] = uVar7;
    *(char_type *)(puVar3[1] + lVar4) = f->value;
  }
  else {
    uVar6 = lVar4 + uVar7;
    if ((ulong)puVar3[3] < uVar6) {
      (**(code **)*puVar3)(puVar3,uVar6);
    }
    puVar3[2] = uVar6;
    __s = (char_type *)(lVar4 + puVar3[1]);
    bVar1 = (byte)spec->fill_;
    uVar7 = uVar7 - 1;
    pcVar5 = __s;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = uVar7 >> 1;
      if (uVar2 != 2) {
        pcVar5 = __s + uVar6;
        memset(__s,(uint)bVar1,uVar6);
      }
      *pcVar5 = f->value;
      if (uVar7 != 0) {
        uVar7 = uVar7 - uVar6;
LAB_0017f743:
        memset(pcVar5 + 1,(uint)bVar1,uVar7);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar7 != 0) {
        pcVar5 = __s + uVar7;
        memset(__s,(uint)bVar1,uVar7);
      }
      *pcVar5 = f->value;
    }
    else {
      *__s = f->value;
      if (uVar7 != 0) goto LAB_0017f743;
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }